

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O1

int exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (float minimum_uniform,char update_zero_elements,long pdf_first,long pdf_last)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar5 = *(ulong *)(pdf_first + 8);
  uVar1 = *(ulong *)(pdf_last + 8);
  iVar2 = 1;
  if (uVar5 <= uVar1 && uVar1 - uVar5 != 0) {
    uVar7 = (long)(uVar1 - uVar5) >> 3;
    if (minimum_uniform <= 0.999) {
      minimum_uniform = minimum_uniform / (float)uVar7;
      fVar9 = 0.0;
      fVar8 = 0.0;
      fVar10 = 0.0;
      if (uVar5 != *(ulong *)(pdf_last + 8)) {
        uVar6 = 0;
        do {
          fVar10 = *(float *)(uVar5 + 4);
          if (((fVar10 <= 0.0) && (fVar10 != 0.0 || update_zero_elements != '\x01')) ||
             (minimum_uniform < fVar10)) {
            fVar8 = fVar8 + fVar10;
          }
          else {
            fVar9 = fVar9 + minimum_uniform;
            *(float *)(uVar5 + 4) = minimum_uniform;
            uVar6 = uVar6 + 1;
          }
          uVar5 = uVar5 + 8;
        } while (uVar5 != *(ulong *)(pdf_last + 8));
        fVar10 = (float)uVar6;
      }
      iVar2 = 0;
      if (0.0 < fVar9) {
        lVar4 = *(long *)(pdf_first + 8);
        if (fVar9 <= 0.999) {
          if (lVar4 != *(long *)(pdf_last + 8)) {
            do {
              if (minimum_uniform < *(float *)(lVar4 + 4)) {
                *(float *)(lVar4 + 4) = *(float *)(lVar4 + 4) * ((1.0 - fVar9) / fVar8);
              }
              lVar4 = lVar4 + 8;
            } while (lVar4 != *(long *)(pdf_last + 8));
          }
        }
        else if (lVar4 != *(long *)(pdf_last + 8)) {
          fVar10 = (1.0 - fVar8) / fVar10;
          do {
            fVar8 = *(float *)(lVar4 + 4);
            if (((0.0 < fVar8) || (fVar8 == 0.0 && update_zero_elements == '\x01')) &&
               (fVar8 <= fVar10)) {
              *(float *)(lVar4 + 4) = fVar10;
            }
            lVar4 = lVar4 + 8;
          } while (lVar4 != *(long *)(pdf_last + 8));
        }
      }
    }
    else {
      uVar3 = uVar5;
      if (uVar5 != uVar1 && update_zero_elements == '\0') {
        do {
          uVar7 = uVar7 - (-(uint)(*(float *)(uVar3 + 4) == 0.0) & 1);
          uVar3 = uVar3 + 8;
        } while (uVar3 != uVar1);
      }
      iVar2 = 0;
      if (uVar5 != *(ulong *)(pdf_last + 8)) {
        do {
          if ((update_zero_elements != '\0') || (0.0 < *(float *)(uVar5 + 4))) {
            *(float *)(uVar5 + 4) = 1.0 / (float)uVar7;
          }
          uVar5 = uVar5 + 8;
        } while (uVar5 != *(ulong *)(pdf_last + 8));
      }
    }
  }
  return iVar2;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }